

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::SetFunctionInRecyclerToProfileMode
          (ScriptContext *this,bool enumerateNonUserFunctionsOnly)

{
  AutoEnumeratingRecyclerObjects local_20;
  AutoEnumeratingRecyclerObjects enumeratingRecyclerObjects;
  
  Output::Trace(ScriptProfilerPhase,
                L"ScriptContext::SetFunctionInRecyclerToProfileMode started (m_fTraceDomCall : %s)\n"
                ,L"False");
  AutoEnumeratingRecyclerObjects::AutoEnumeratingRecyclerObjects(&local_20,this);
  this->m_enumerateNonUserFunctionsOnly = enumerateNonUserFunctionsOnly;
  Memory::Recycler::EnumerateObjects
            (this->recycler,EnumClassMask,RecyclerEnumClassEnumeratorCallback);
  Output::Trace(ScriptProfilerPhase,L"ScriptContext::SetFunctionInRecyclerToProfileMode ended\n");
  AutoEnumeratingRecyclerObjects::~AutoEnumeratingRecyclerObjects(&local_20);
  return;
}

Assistant:

void ScriptContext::SetFunctionInRecyclerToProfileMode(bool enumerateNonUserFunctionsOnly/* = false*/)
    {
        OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::SetFunctionInRecyclerToProfileMode started (m_fTraceDomCall : %s)\n"), IsTrueOrFalse(IsTraceDomCall()));

        // Mark this script context isEnumeratingRecyclerObjects
        AutoEnumeratingRecyclerObjects enumeratingRecyclerObjects(this);

        m_enumerateNonUserFunctionsOnly = enumerateNonUserFunctionsOnly;

        this->recycler->EnumerateObjects(JavascriptLibrary::EnumFunctionClass, &ScriptContext::RecyclerEnumClassEnumeratorCallback);

        OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("ScriptContext::SetFunctionInRecyclerToProfileMode ended\n"));
    }